

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

Aig_Man_t * Saig_SynchSequenceApply(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Str_t *vSequence;
  abctime aVar3;
  Vec_Ptr_t *vSimInfo;
  Aig_Man_t *pAVar4;
  
  aVar2 = Abc_Clock();
  vSequence = Saig_SynchSequence(pAig,nWords);
  if (vSequence == (Vec_Str_t *)0x0) {
    iVar1 = 0x8583c2;
    printf("Design 1: Synchronizing sequence is not found. ");
    if (fVerbose == 0) goto LAB_005a2dbf;
  }
  else {
    if (fVerbose == 0) {
LAB_005a2dbf:
      putchar(10);
      goto LAB_005a2dc7;
    }
    iVar1 = 0x8583f2;
    printf("Design 1: Synchronizing sequence of length %4d is found. ",
           (long)vSequence->nSize / (long)pAig->nTruePis & 0xffffffff,
           (long)vSequence->nSize % (long)pAig->nTruePis & 0xffffffff);
  }
  Abc_Print(iVar1,"%s =","Time");
  aVar3 = Abc_Clock();
  Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
LAB_005a2dc7:
  if (vSequence == (Vec_Str_t *)0x0) {
    puts("Quitting synchronization.");
    pAVar4 = (Aig_Man_t *)0x0;
  }
  else {
    vSimInfo = Vec_PtrAllocSimInfo(pAig->vObjs->nSize,1);
    iVar1 = Saig_SynchSequenceRun(pAig,vSimInfo,vSequence,1);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigSynch.c"
                    ,0x214,"Aig_Man_t *Saig_SynchSequenceApply(Aig_Man_t *, int, int)");
    }
    pAVar4 = Saig_ManDupInitZero(pAig);
    Vec_PtrFree(vSimInfo);
    Vec_StrFree(vSequence);
    Aig_ManCleanMarkA(pAig);
  }
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_SynchSequenceApply( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Aig_Man_t * pAigZero;
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;

clk = Abc_Clock();
    // derive synchronization sequence
    vSequence = Saig_SynchSequence( pAig, nWords );
    if ( vSequence == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSequence) / Saig_ManPiNum(pAig) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );
    if ( vSequence == NULL )
    {
        printf( "Quitting synchronization.\n" );
        return NULL;
    }

    // apply synchronization sequence
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), 1 );
    RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
    assert( RetValue == 0 );
    // duplicate 
    pAigZero = Saig_ManDupInitZero( pAig );
    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSequence );
    Aig_ManCleanMarkA( pAig );
    return pAigZero;
}